

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O3

bool __thiscall icu_63::RBBITableBuilder::findDuplicateState(RBBITableBuilder *this,IntPair *states)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  
  iVar1 = this->fDStates->count;
  uVar2 = RBBISetBuilder::getNumCharCategories(this->fRB->fSetBuilder);
  iVar5 = states->first;
  if (iVar5 < iVar1 + -1) {
    do {
      pvVar3 = UVector::elementAt(this->fDStates,iVar5);
      iVar5 = states->first + 1;
      states->second = iVar5;
      if (iVar5 < iVar1) {
        do {
          pvVar4 = UVector::elementAt(this->fDStates,iVar5);
          if (((*(int *)((long)pvVar3 + 4) == *(int *)((long)pvVar4 + 4)) &&
              (*(int *)((long)pvVar3 + 8) == *(int *)((long)pvVar4 + 8))) &&
             (*(int *)((long)pvVar3 + 0x18) == *(int *)((long)pvVar4 + 0x18))) {
            if ((int)uVar2 < 1) {
              return true;
            }
            uVar6 = 0;
            while( true ) {
              iVar7 = 0;
              iVar5 = 0;
              if ((long)uVar6 < (long)*(int *)(*(long *)((long)pvVar3 + 0x28) + 8)) {
                iVar5 = *(int *)(*(long *)(*(long *)((long)pvVar3 + 0x28) + 0x18) + uVar6 * 4);
              }
              if ((long)uVar6 < (long)*(int *)(*(long *)((long)pvVar4 + 0x28) + 8)) {
                iVar7 = *(int *)(*(long *)(*(long *)((long)pvVar4 + 0x28) + 0x18) + uVar6 * 4);
              }
              if ((iVar5 != iVar7) &&
                 (((iVar5 != states->first && (iVar5 != states->second)) ||
                  ((iVar7 != states->first && (iVar7 != states->second)))))) break;
              uVar6 = uVar6 + 1;
              if (uVar2 == uVar6) {
                return true;
              }
            }
          }
          iVar5 = states->second + 1;
          states->second = iVar5;
        } while (iVar5 < iVar1);
        iVar5 = states->first + 1;
      }
      states->first = iVar5;
    } while (iVar5 < iVar1 + -1);
  }
  return false;
}

Assistant:

bool RBBITableBuilder::findDuplicateState(IntPair *states) {
    int32_t numStates = fDStates->size();
    int32_t numCols = fRB->fSetBuilder->getNumCharCategories();

    for (; states->first<numStates-1; states->first++) {
        RBBIStateDescriptor *firstSD = (RBBIStateDescriptor *)fDStates->elementAt(states->first);
        for (states->second=states->first+1; states->second<numStates; states->second++) {
            RBBIStateDescriptor *duplSD = (RBBIStateDescriptor *)fDStates->elementAt(states->second);
            if (firstSD->fAccepting != duplSD->fAccepting ||
                firstSD->fLookAhead != duplSD->fLookAhead ||
                firstSD->fTagsIdx   != duplSD->fTagsIdx) {
                continue;
            }
            bool rowsMatch = true;
            for (int32_t col=0; col < numCols; ++col) {
                int32_t firstVal = firstSD->fDtran->elementAti(col);
                int32_t duplVal = duplSD->fDtran->elementAti(col);
                if (!((firstVal == duplVal) ||
                        ((firstVal == states->first || firstVal == states->second) &&
                        (duplVal  == states->first || duplVal  == states->second)))) {
                    rowsMatch = false;
                    break;
                }
            }
            if (rowsMatch) {
                return true;
            }
        }
    }
    return false;
}